

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MediaManager.cpp
# Opt level: O2

int __thiscall MediaManager::GetTypeFromBuffer(MediaManager *this,uchar *buffer,int size)

{
  int iVar1;
  int iVar2;
  
  if (*(long *)buffer == 0x414e53202d20564d) {
    iVar2 = 1;
  }
  else if (*(long *)buffer == 0x524e53202d205752) {
    iVar2 = 5;
  }
  else {
    iVar2 = 3;
    if ((((*(long *)buffer != 0x435043202d20564d) && (*(long *)buffer != 0x4445444e45545845)) &&
        (iVar1 = bcmp(buffer,"SCP",3), iVar1 != 0)) &&
       ((*(int *)buffer != 0x53504143 && (*(long *)buffer != 0x4546434950435848)))) {
      iVar1 = bcmp(buffer,"ZXTape!",7);
      iVar2 = 4;
      if ((iVar1 != 0) &&
         ((((size < 0xc || (*(int *)buffer != 0x46464952)) || (*(int *)(buffer + 8) != 0x45564157))
          && ((iVar1 = bcmp(buffer,"Compressed Square Wave",0x16), iVar1 != 0 &&
              (iVar1 = bcmp(buffer,"Creative Voice File",0x13), iVar1 != 0)))))) {
        if ((size < 0xc) || ((*(int *)(buffer + 8) != 0x21534d41 || (*(int *)buffer != 0x46464952)))
           ) {
          iVar2 = 0;
        }
        else {
          iVar2 = 8;
        }
      }
    }
  }
  return iVar2;
}

Assistant:

int MediaManager::GetTypeFromBuffer(unsigned char* buffer, int size)
{
   if (memcmp(buffer, "MV - SNA", 8) == 0)
      return MEDIA_SNA;
   else if (memcmp(buffer, "RW - SNR", 8) == 0)
      return MEDIA_SNR;
   else if ((memcmp(buffer, "MV - CPC", 8) == 0)
      || (memcmp(buffer, "EXTENDED", 8) == 0)
      || (memcmp(buffer, "SCP", 3) == 0)
      || (memcmp(buffer, "CAPS", 4) == 0)
      || (memcmp(buffer, "HXCPICFE", 8) == 0)
#ifdef SUPPORT_SFWR
      || (memcmp(buffer, "FORM", 4) == 0)
#endif
   )
      // SNA, ROM or DSK ?
      return MEDIA_DISK;
      // Tape : CDT, TAP
   else if ((memcmp(buffer, "ZXTape!", 7) == 0)
      || (size >= 12 && (memcmp(buffer, "RIFF", 4) == 0) && (memcmp(&buffer[8], "WAVE", 4) == 0))
      || (memcmp(buffer, "Compressed Square Wave", 22) == 0)
      || (memcmp(buffer, "Creative Voice File", 19) == 0)
   )
      return MEDIA_TAPE;
   else if (size >= 12 && (memcmp(&buffer[8], "AMS!", 4) == 0) && (memcmp(&buffer[0], "RIFF", 4) == 0))
   {
      return MEDIA_CPR;
   }
   else return MEDIA_UNDEF;
}